

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_cx_iface.c
# Opt level: O2

aom_codec_err_t
ctrl_set_bitrate_one_pass_cbr(aom_codec_alg_priv_t_conflict *ctx,__va_list_tag *args)

{
  uint uVar1;
  AV1_PRIMARY *ppi;
  AV1_COMP *cpi;
  int iVar2;
  aom_codec_err_t aVar3;
  uint *puVar4;
  
  ppi = ctx->ppi;
  cpi = ppi->cpi;
  iVar2 = is_one_pass_rt_params(cpi);
  aVar3 = AOM_CODEC_INVALID_PARAM;
  if ((((iVar2 != 0) && ((cpi->oxcf).rc_cfg.mode == AOM_CBR)) && (cpi->ppi->use_svc == 0)) &&
     ((ppi->num_fp_contexts == 1 && (ppi->cpi_lap == (AV1_COMP *)0x0)))) {
    uVar1 = args->gp_offset;
    if ((ulong)uVar1 < 0x29) {
      puVar4 = (uint *)((ulong)uVar1 + (long)args->reg_save_area);
      args->gp_offset = uVar1 + 8;
    }
    else {
      puVar4 = (uint *)args->overflow_arg_area;
      args->overflow_arg_area = puVar4 + 2;
    }
    uVar1 = *puVar4;
    (ctx->cfg).rc_target_bitrate = uVar1;
    (cpi->oxcf).rc_cfg.target_bandwidth = (long)(int)uVar1 * 1000;
    set_primary_rc_buffer_sizes(&cpi->oxcf,ppi);
    av1_new_framerate(cpi,cpi->framerate);
    check_reset_rc_flag(cpi);
    aVar3 = AOM_CODEC_OK;
  }
  return aVar3;
}

Assistant:

static aom_codec_err_t ctrl_set_bitrate_one_pass_cbr(aom_codec_alg_priv_t *ctx,
                                                     va_list args) {
  AV1_PRIMARY *const ppi = ctx->ppi;
  AV1_COMP *const cpi = ppi->cpi;
  AV1EncoderConfig *oxcf = &cpi->oxcf;
  if (!is_one_pass_rt_params(cpi) || oxcf->rc_cfg.mode != AOM_CBR ||
      cpi->ppi->use_svc || ppi->num_fp_contexts != 1 || ppi->cpi_lap != NULL) {
    return AOM_CODEC_INVALID_PARAM;
  }
  const int new_bitrate = CAST(AV1E_SET_BITRATE_ONE_PASS_CBR, args);
  ctx->cfg.rc_target_bitrate = new_bitrate;
  oxcf->rc_cfg.target_bandwidth = new_bitrate * 1000;
  set_primary_rc_buffer_sizes(oxcf, ppi);
  av1_new_framerate(cpi, cpi->framerate);
  check_reset_rc_flag(cpi);
  return AOM_CODEC_OK;
}